

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::init(TextureCubeShadowCase *this,EVP_PKEY_CTX *ctx)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  TextureCube *pTVar4;
  RenderContext *pRVar5;
  TextureCube *pTVar6;
  PixelBufferAccess *pPVar7;
  RenderTarget *this_00;
  bool bVar8;
  float local_374;
  float local_368;
  Vector<float,_2> local_2f8;
  Vector<float,_2> local_2f0;
  FilterCase local_2e8;
  Vector<float,_2> local_2c8;
  Vector<float,_2> local_2c0;
  FilterCase local_2b8;
  Vector<float,_2> local_298;
  Vector<float,_2> local_290;
  FilterCase local_288;
  Vector<float,_2> local_268;
  Vector<float,_2> local_260;
  FilterCase local_258;
  Vector<float,_2> local_238;
  Vector<float,_2> local_230;
  FilterCase local_228;
  Vector<float,_2> local_208;
  Vector<float,_2> local_200;
  FilterCase local_1f8;
  Vector<float,_2> local_1d8;
  Vector<float,_2> local_1d0;
  FilterCase local_1c8;
  Vector<float,_2> local_1a8;
  Vector<float,_2> local_1a0;
  FilterCase local_198;
  byte local_171;
  undefined4 local_170;
  undefined4 uStack_16c;
  bool singleSample;
  float refOutOfBoundsLower;
  float refOutOfBoundsUpper;
  float refInRangeLower;
  float refInRangeUpper;
  exception *anon_var_0;
  Vector<float,_4> local_150;
  Vector<float,_4> local_140;
  Vec4 local_130;
  RGBA local_120;
  Vector<float,_4> local_11c;
  Vector<float,_4> local_10c;
  Vec4 local_fc;
  uint local_ec;
  uint local_e8;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  int face_1;
  Vec4 local_c4;
  Vector<float,_4> local_b4;
  Vec4 local_a4;
  int local_94;
  CubeFace local_90;
  int levelNdx;
  int face;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  int numLevels;
  TextureCubeShadowCase *this_local;
  
  iVar2 = deLog2Floor32(this->m_size);
  iVar2 = iVar2 + 1;
  fmtInfo.lookupBias.m_data._8_8_ = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo
            ((TextureFormatInfo *)(cBias.m_data + 2),
             (TextureFormat *)(fmtInfo.lookupBias.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator-((tcu *)&levelNdx,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  pTVar4 = (TextureCube *)operator_new(0x180);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TextureCube::TextureCube(pTVar4,pRVar5,this->m_format,this->m_size);
  this->m_gradientTex = pTVar4;
  pTVar4 = (TextureCube *)operator_new(0x180);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TextureCube::TextureCube(pTVar4,pRVar5,this->m_format,this->m_size);
  this->m_gridTex = pTVar4;
  if (init()::gradients == '\0') {
    iVar3 = __cxa_guard_acquire(&init()::gradients);
    if (iVar3 != 0) {
      tcu::Vector<float,_4>::Vector(init::gradients[0],-1.0,-1.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[0] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1],0.0,-1.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2],-1.0,0.0,-1.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3],-1.0,-1.0,0.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4],-1.0,-1.0,-1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4] + 1,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5],0.0,0.0,0.0,2.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5] + 1,1.0,1.0,1.0,0.0);
      __cxa_guard_release(&init()::gradients);
    }
  }
  for (local_90 = CUBEFACE_NEGATIVE_X; (int)local_90 < 6; local_90 = local_90 + CUBEFACE_POSITIVE_X)
  {
    for (local_94 = 0; local_94 < iVar2; local_94 = local_94 + 1) {
      pTVar6 = glu::TextureCube::getRefTexture(this->m_gradientTex);
      tcu::TextureCube::allocLevel(pTVar6,local_90,local_94);
      pTVar6 = glu::TextureCube::getRefTexture(this->m_gradientTex);
      pPVar7 = tcu::TextureCube::getLevelFace(pTVar6,local_94,local_90);
      tcu::operator*((tcu *)&local_b4,init::gradients[(int)local_90],(Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_a4,&local_b4,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::operator*((tcu *)&levelNdx_1,init::gradients[(int)local_90] + 1,
                     (Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_c4,(Vector<float,_4> *)&levelNdx_1,
                     (Vector<float,_4> *)(cScale.m_data + 2));
      tcu::fillWithComponentGradients(pPVar7,&local_a4,&local_c4);
    }
  }
  for (step = 0; (int)step < 6; step = step + 1) {
    for (rgb = 0; (int)rgb < iVar2; rgb = rgb + 1) {
      colorA = (deUint32)(0xffffff / (long)(iVar2 * 6));
      colorB = colorA * rgb * step;
      local_e8 = colorB | 0xff000000;
      local_ec = ~colorB | 0xff000000;
      pTVar6 = glu::TextureCube::getRefTexture(this->m_gridTex);
      tcu::TextureCube::allocLevel(pTVar6,step,rgb);
      pTVar6 = glu::TextureCube::getRefTexture(this->m_gridTex);
      pPVar7 = tcu::TextureCube::getLevelFace(pTVar6,rgb,step);
      tcu::RGBA::RGBA(&local_120,local_e8);
      tcu::RGBA::toVec((RGBA *)&local_11c);
      tcu::operator*((tcu *)&local_10c,&local_11c,(Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_fc,&local_10c,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::RGBA::RGBA((RGBA *)((long)&anon_var_0 + 4),local_ec);
      tcu::RGBA::toVec((RGBA *)&local_150);
      tcu::operator*((tcu *)&local_140,&local_150,(Vector<float,_4> *)&levelNdx);
      tcu::operator+((tcu *)&local_130,&local_140,(Vector<float,_4> *)(cScale.m_data + 2));
      tcu::fillWithGrid(pPVar7,4,&local_fc,&local_130);
    }
  }
  glu::TextureCube::upload(this->m_gradientTex);
  glu::TextureCube::upload(this->m_gridTex);
  bVar8 = true;
  if (this->m_compareFunc != 0x202) {
    bVar8 = this->m_compareFunc == 0x205;
  }
  local_368 = 1.0;
  if (!bVar8) {
    local_368 = 0.5;
  }
  refOutOfBoundsUpper = local_368;
  bVar8 = true;
  if (this->m_compareFunc != 0x202) {
    bVar8 = this->m_compareFunc == 0x205;
  }
  local_374 = 0.0;
  if (!bVar8) {
    local_374 = 0.5;
  }
  refOutOfBoundsLower = local_374;
  uStack_16c = 0x3f8ccccd;
  local_170 = 0xbdcccccd;
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getNumSamples(this_00);
  fVar1 = refOutOfBoundsUpper;
  local_171 = iVar2 == 0;
  if ((bool)local_171) {
    pTVar4 = this->m_gradientTex;
    tcu::Vector<float,_2>::Vector(&local_1a0,-1.25,-1.2);
    tcu::Vector<float,_2>::Vector(&local_1a8,1.2,1.25);
    FilterCase::FilterCase(&local_198,pTVar4,fVar1,&local_1a0,&local_1a8);
    std::
    vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_198);
  }
  else {
    pTVar4 = this->m_gradientTex;
    tcu::Vector<float,_2>::Vector(&local_1d0,-1.19,-1.3);
    tcu::Vector<float,_2>::Vector(&local_1d8,1.1,1.35);
    FilterCase::FilterCase(&local_1c8,pTVar4,fVar1,&local_1d0,&local_1d8);
    std::
    vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_1c8);
  }
  fVar1 = refOutOfBoundsLower;
  pTVar4 = this->m_gradientTex;
  tcu::Vector<float,_2>::Vector(&local_200,0.8,0.8);
  tcu::Vector<float,_2>::Vector(&local_208,1.25,1.2);
  FilterCase::FilterCase(&local_1f8,pTVar4,fVar1,&local_200,&local_208);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_1f8);
  fVar1 = refOutOfBoundsUpper;
  pTVar4 = this->m_gridTex;
  tcu::Vector<float,_2>::Vector(&local_230,-1.19,-1.3);
  tcu::Vector<float,_2>::Vector(&local_238,1.1,1.35);
  FilterCase::FilterCase(&local_228,pTVar4,fVar1,&local_230,&local_238);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_228);
  fVar1 = refOutOfBoundsLower;
  pTVar4 = this->m_gridTex;
  tcu::Vector<float,_2>::Vector(&local_260,-1.2,-1.1);
  tcu::Vector<float,_2>::Vector(&local_268,-0.8,-0.8);
  FilterCase::FilterCase(&local_258,pTVar4,fVar1,&local_260,&local_268);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_258);
  pTVar4 = this->m_gridTex;
  tcu::Vector<float,_2>::Vector(&local_290,-0.61,-0.1);
  tcu::Vector<float,_2>::Vector(&local_298,0.9,1.18);
  FilterCase::FilterCase(&local_288,pTVar4,1.1,&local_290,&local_298);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::push_back(&this->m_cases,&local_288);
  if ((local_171 & 1) == 0) {
    pTVar4 = this->m_gridTex;
    tcu::Vector<float,_2>::Vector(&local_2f0,-0.75,1.0);
    tcu::Vector<float,_2>::Vector(&local_2f8,0.25,0.75);
    FilterCase::FilterCase(&local_2e8,pTVar4,-0.1,&local_2f0,&local_2f8);
    std::
    vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_2e8);
  }
  else {
    pTVar4 = this->m_gridTex;
    tcu::Vector<float,_2>::Vector(&local_2c0,-0.75,1.0);
    tcu::Vector<float,_2>::Vector(&local_2c8,0.05,0.75);
    FilterCase::FilterCase(&local_2b8,pTVar4,-0.1,&local_2c0,&local_2c8);
    std::
    vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_2b8);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeShadowCase::init (void)
{
	try
	{
		DE_ASSERT(!m_gradientTex && !m_gridTex);

		int						numLevels	= deLog2Floor32(m_size)+1;
		tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		tcu::Vec4				cBias		= fmtInfo.valueMin;
		tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Create textures.
		m_gradientTex	= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);
		m_gridTex		= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);

		// Fill first with gradient texture.
		static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_gradientTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				deUint32	rgb		= step*levelNdx*face;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_gridTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_gridTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureCubeShadowCase::deinit();
		throw;
	}

	// Compute cases
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;
		const float refOutOfBoundsLower	= -0.1f;
		const bool	singleSample		= m_context.getRenderTarget().getNumSamples() == 0;

		if (singleSample)
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f)));	// minification
		else
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification - w/ tuned coordinates to avoid hitting triangle edges

		m_cases.push_back(FilterCase(m_gradientTex,	refInRangeLower,		tcu::Vec2(0.8f, 0.8f), tcu::Vec2(1.25f, 1.20f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeUpper,		tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeLower,		tcu::Vec2(-1.2f, -1.1f), tcu::Vec2(-0.8f, -0.8f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refOutOfBoundsUpper,	tcu::Vec2(-0.61f, -0.1f), tcu::Vec2(0.9f, 1.18f)));	// reference value clamp, upper

		if (singleSample)
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.05f, 0.75f)));	// reference value clamp, lower
		else
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.25f, 0.75f)));	// reference value clamp, lower
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}